

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

Seq __thiscall xt::VSeq::next(VSeq *this)

{
  int iVar1;
  element_type *peVar2;
  VSeq *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  Seq SVar4;
  shared_ptr<xt::_Vector> local_28;
  VSeq *this_local;
  
  iVar1 = *(int *)(in_RSI + 0x18);
  this_local = this;
  peVar2 = std::__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<xt::_Vector,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      (in_RSI + 8));
  if (iVar1 + 1U < peVar2->cnt) {
    this_00 = (VSeq *)operator_new(0x20);
    std::shared_ptr<xt::_Vector>::shared_ptr(&local_28,(shared_ptr<xt::_Vector> *)(in_RSI + 8));
    VSeq(this_00,&local_28,*(int *)(in_RSI + 0x18) + 1);
    std::shared_ptr<xt::ISeq>::shared_ptr<xt::VSeq,void>((shared_ptr<xt::ISeq> *)this,this_00);
    std::shared_ptr<xt::_Vector>::~shared_ptr(&local_28);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<xt::ISeq>::shared_ptr((shared_ptr<xt::ISeq> *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  SVar4.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  SVar4.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_ISeq;
  return (Seq)SVar4.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Seq VSeq::next() const { if (index+1 < v->cnt) return Seq(new VSeq(v, index+1));  return Seq(); }